

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

uint * RDL_giveURF(RDL_data *data,uint index,char mode)

{
  uint bcc_index;
  uint uVar1;
  RDL_graph *pRVar2;
  char *edges;
  void *__ptr;
  uint *puVar3;
  RDL_node *pRVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined7 in_register_00000011;
  uint uVar8;
  ulong uVar9;
  uint rcf_internal_index;
  
  iVar6 = (int)CONCAT71(in_register_00000011,mode);
  if (iVar6 == 0x62) {
    bcc_index = data->urf_to_bcc[index][0];
    uVar8 = data->urf_to_bcc[index][1];
    pRVar2 = data->bccGraphs->bcc_graphs[bcc_index];
    uVar5 = (ulong)pRVar2->E;
    edges = (char *)calloc(1,uVar5);
    uVar1 = data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[uVar8];
    __ptr = malloc(0x100);
    if (uVar1 != 0) {
      rcf_internal_index = 0;
      do {
        RDL_getEdges_internal(data,bcc_index,uVar8,rcf_internal_index,edges);
        rcf_internal_index = rcf_internal_index + 1;
      } while (uVar1 != rcf_internal_index);
      uVar5 = (ulong)pRVar2->E;
    }
    if ((int)uVar5 == 0) {
      uVar8 = 0;
    }
    else {
      uVar7 = 0x40;
      uVar9 = 0;
      uVar8 = 0;
      do {
        if (edges[uVar9] == '\x01') {
          if (uVar8 == (uint)uVar7) {
            uVar7 = (ulong)(uVar8 * 2);
            __ptr = realloc(__ptr,uVar7 * 4);
          }
          uVar5 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          *(uint *)((long)__ptr + uVar5 * 4) =
               data->bccGraphs->edge_from_bcc_mapping[bcc_index][uVar9];
          uVar5 = (ulong)pRVar2->E;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar5);
    }
    puVar3 = (uint *)realloc(__ptr,(ulong)(uVar8 + 1) << 2);
    puVar3[uVar8] = 0xffffffff;
    free(edges);
    return puVar3;
  }
  if (iVar6 != 0x61) {
    (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_giveURF()\' with invalid mode \'%c\'\n",
                      (ulong)(uint)(int)mode);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                  ,0x2b2,"unsigned int *RDL_giveURF(const RDL_data *, unsigned int, char)");
  }
  pRVar4 = RDL_getNodesURF(data,index);
  return pRVar4;
}

Assistant:

static unsigned *RDL_giveURF(const RDL_data *data, unsigned index, char mode)
{
  unsigned *result;
  if(mode == 'a')
  {
    result = RDL_getNodesURF(data, index);
  }
  else if(mode == 'b')
  {
    result = RDL_getEdgesURF(data, index);
  }
  else
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_giveURF()' with invalid mode '%c'\n", mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  return result;
}